

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int apply_remote_transport_params(quicly_conn_t *conn)

{
  uint64_t count;
  int iVar1;
  
  count = (conn->super).remote.transport_params.max_streams_uni;
  (conn->egress).max_data.permitted = (conn->super).remote.transport_params.max_data;
  iVar1 = update_max_streams(&(conn->egress).max_streams.uni,count);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = update_max_streams(&(conn->egress).max_streams.bidi,
                             (conn->super).remote.transport_params.max_streams_bidi);
  return iVar1;
}

Assistant:

static int apply_remote_transport_params(quicly_conn_t *conn)
{
    int ret;

    conn->egress.max_data.permitted = conn->super.remote.transport_params.max_data;
    if ((ret = update_max_streams(&conn->egress.max_streams.uni, conn->super.remote.transport_params.max_streams_uni)) != 0)
        return ret;
    if ((ret = update_max_streams(&conn->egress.max_streams.bidi, conn->super.remote.transport_params.max_streams_bidi)) != 0)
        return ret;

    return 0;
}